

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_buffer.h
# Opt level: O2

void __thiscall absl::lts_20250127::CordBuffer::IncreaseLengthBy(CordBuffer *this,size_t n)

{
  size_t sVar1;
  size_t sVar2;
  CordRepFlat *pCVar3;
  anon_class_1_0_00000001 local_19;
  
  sVar1 = capacity(this);
  if (n <= sVar1) {
    sVar1 = length(this);
    sVar2 = capacity(this);
    if (sVar1 + n <= sVar2) goto LAB_002052d6;
  }
  IncreaseLengthBy::anon_class_1_0_00000001::operator()(&local_19);
LAB_002052d6:
  if (((this->rep_).field_0.short_rep.raw_size & 1U) == 0) {
    pCVar3 = Rep::rep(&this->rep_);
    (pCVar3->super_CordRep).length = (pCVar3->super_CordRep).length + n;
  }
  else {
    Rep::add_short_length(&this->rep_,n);
  }
  return;
}

Assistant:

inline void CordBuffer::IncreaseLengthBy(size_t n) {
  ABSL_HARDENING_ASSERT(n <= capacity() && length() + n <= capacity());
  if (rep_.is_short()) {
    rep_.add_short_length(n);
  } else {
    rep_.rep()->length += n;
  }
}